

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunay.c
# Opt level: O2

void getPointsBoudingBox(GLfloat (*points) [2],GLsizei n_points,GLfloat (*bounds) [2])

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  
  if (n_points != 0) {
    dVar9 = (double)SUB84(*points,0);
    dVar11 = (double)SUB84(*points,4);
    lVar2 = 1;
    uVar3 = SUB84(dVar9,0);
    uVar4 = (undefined4)((ulong)dVar9 >> 0x20);
    uVar5 = SUB84(dVar11,0);
    uVar6 = (undefined4)((ulong)dVar11 >> 0x20);
    while( true ) {
      if (n_points <= lVar2) break;
      auVar7._0_8_ = (double)SUB84(points[lVar2],0);
      auVar7._8_8_ = (double)SUB84(points[lVar2],4);
      auVar10._8_8_ = auVar7._8_8_;
      auVar10._0_8_ = auVar7._0_8_;
      auVar8._8_4_ = SUB84(dVar11,0);
      auVar8._0_8_ = dVar9;
      auVar8._12_4_ = (int)((ulong)dVar11 >> 0x20);
      auVar10 = minpd(auVar10,auVar8);
      auVar1._4_4_ = uVar4;
      auVar1._0_4_ = uVar3;
      auVar1._8_4_ = uVar5;
      auVar1._12_4_ = uVar6;
      auVar8 = maxpd(auVar7,auVar1);
      lVar2 = lVar2 + 1;
      dVar9 = auVar10._0_8_;
      dVar11 = auVar10._8_8_;
      uVar3 = auVar8._0_4_;
      uVar4 = auVar8._4_4_;
      uVar5 = auVar8._8_4_;
      uVar6 = auVar8._12_4_;
    }
    (*bounds)[0] = (float)dVar9;
    (*bounds)[1] = (float)dVar11;
    bounds[1][0] = (float)(double)CONCAT44(uVar4,uVar3);
    bounds[1][1] = (float)(double)CONCAT44(uVar6,uVar5);
  }
  return;
}

Assistant:

void getPointsBoudingBox(GLfloat points[][2], GLsizei n_points, GLfloat bounds[][2]) {
	if (n_points == 0) return;

	double x_min, x_max, y_min, y_max;
	x_min = x_max = points[0][0];
	y_min = y_max = points[0][1];

	for (GLsizei i = 1; i < n_points; i++) {
		x_min = MIN(points[i][0], x_min);
		x_max = MAX(points[i][0], x_max);
		y_min = MIN(points[i][1], y_min);
		y_max = MAX(points[i][1], y_max);
	}

	bounds[0][0] = x_min;
	bounds[0][1] = y_min;
	bounds[1][0] = x_max;
	bounds[1][1] = y_max;
}